

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O1

wchar_t archive_string_normalize_C(archive_string *as,void *_p,size_t len,archive_string_conv *sc)

{
  char cVar1;
  wchar_t wVar2;
  uint uVar3;
  uint uVar4;
  uint32_t uVar5;
  uint uVar6;
  int iVar7;
  archive_string *paVar8;
  archive_string *paVar9;
  long lVar10;
  size_t sVar11;
  undefined7 uVar13;
  char *pcVar12;
  int iVar14;
  ulong uVar15;
  int iVar16;
  char *pcVar17;
  char *pcVar18;
  undefined4 uVar19;
  undefined1 *puVar20;
  uint uVar21;
  undefined8 unaff_R15;
  undefined7 uVar25;
  char *pcVar22;
  ulong uVar23;
  long lVar24;
  bool bVar26;
  uint32_t uc2;
  uint32_t ucx [10];
  wchar_t ccx [10];
  uint32_t local_104;
  archive_string *local_100;
  size_t local_f8;
  char *local_f0;
  ulong local_e8;
  code *local_e0;
  long local_d8;
  char *local_d0;
  long local_c8;
  wchar_t local_bc;
  ulong local_b8;
  long local_b0;
  char *local_a8;
  uint local_a0;
  undefined4 local_9c;
  code *local_98;
  uint local_90;
  uint local_8c;
  uint local_88;
  uint local_84;
  undefined1 local_80 [32];
  ulong local_60;
  uint local_58 [10];
  
  wVar2 = sc->flag;
  uVar13 = (undefined7)((ulong)sc >> 8);
  uVar25 = (undefined7)((ulong)unaff_R15 >> 8);
  if (((uint)wVar2 >> 10 & 1) == 0) {
    if (((uint)wVar2 >> 0xc & 1) == 0) {
      if (((uint)wVar2 >> 8 & 1) == 0) {
        if (((uint)wVar2 >> 0xb & 1) == 0) {
          uVar21 = (uint)wVar2 >> 0xd & 1;
          uVar23 = (ulong)uVar21;
          local_d8 = uVar23 + 1;
          local_e0 = unicode_to_utf8;
          if (uVar21 != 0) {
            local_e0 = unicode_to_utf16le;
          }
        }
        else {
          local_e0 = unicode_to_utf16be;
          local_d8 = 2;
          uVar23 = CONCAT71(uVar25,1);
        }
        local_9c = 0;
      }
      else {
        local_9c = (undefined4)CONCAT71(uVar13,((uint)wVar2 >> 9 & 1) == 0);
        local_e0 = unicode_to_utf8;
        local_d8 = 1;
        uVar23 = 0;
      }
      goto LAB_0016a483;
    }
    local_9c = (undefined4)CONCAT71(uVar13,((uint)wVar2 >> 0xd & 1) == 0);
    local_e0 = unicode_to_utf16le;
  }
  else {
    local_9c = (undefined4)CONCAT71(uVar13,((uint)wVar2 >> 0xb & 1) == 0);
    local_e0 = unicode_to_utf16be;
  }
  local_d8 = 2;
  uVar23 = CONCAT71(uVar25,1);
LAB_0016a483:
  local_c8 = 1;
  local_90 = 4;
  if (((uint)wVar2 >> 0xb & 1) == 0) {
    if (((uint)wVar2 >> 0xd & 1) == 0) {
      local_98 = cesu8_to_unicode;
      local_90 = 6;
      local_c8 = local_d8;
    }
    else {
      local_98 = utf16le_to_unicode;
    }
  }
  else {
    local_98 = utf16be_to_unicode;
  }
  local_100 = as;
  local_f8 = len;
  paVar8 = archive_string_ensure(as,local_c8 * len + local_d8 + as->length);
  if (paVar8 == (archive_string *)0x0) {
LAB_0016b8b6:
    local_bc = L'\xffffffff';
  }
  else {
    pcVar17 = local_100->s;
    sVar11 = local_100->buffer_length;
    pcVar18 = pcVar17 + local_100->length;
    local_60 = uVar23;
    local_b8 = (*local_98)(&local_104,_p,local_f8);
    if ((int)local_b8 == 0) {
      local_bc = L'\0';
    }
    else {
      local_b0 = -local_d8;
      pcVar17 = pcVar17 + local_b0 + sVar11;
      local_bc = L'\0';
      do {
        if ((int)(uint)local_b8 < 0) {
          lVar10 = (*local_e0)(pcVar18,(long)pcVar17 - (long)pcVar18,local_104);
          local_d0 = (char *)_p;
          if (lVar10 == 0) {
            sVar11 = (long)pcVar18 - (long)local_100->s;
            lVar24 = local_f8 * local_c8 + local_d8;
            while( true ) {
              local_100->length = sVar11;
              paVar8 = archive_string_ensure(local_100,local_100->buffer_length + lVar24);
              pcVar12 = local_d0;
              if (paVar8 == (archive_string *)0x0) break;
              pcVar18 = local_100->s + local_100->length;
              pcVar17 = local_100->s + local_b0 + local_100->buffer_length;
              lVar10 = (*local_e0)(pcVar18,(long)pcVar17 - (long)pcVar18,local_104);
              if (lVar10 != 0) goto LAB_0016b49d;
              sVar11 = (long)pcVar18 - (long)local_100->s;
            }
            goto LAB_0016b681;
          }
LAB_0016b49d:
          pcVar18 = pcVar18 + lVar10;
          iVar7 = (int)local_b8;
LAB_0016b6e6:
          local_d0 = local_d0 + (uint)-iVar7;
          local_f8 = local_f8 - (uint)-iVar7;
          iVar16 = 2;
          local_bc = L'\xffffffff';
        }
        else {
          local_f0 = (char *)_p;
          if ((uint)local_b8 == local_90) {
            local_f0 = (char *)0x0;
          }
          if ((char)local_9c != '\0') {
            local_f0 = (char *)0x0;
          }
          local_d0 = (char *)((long)_p + (local_b8 & 0xffffffff));
          local_f8 = local_f8 - (local_b8 & 0xffffffff);
          do {
            pcVar12 = local_d0;
            uVar3 = (*local_98)(&local_a0,local_d0,local_f8);
            uVar21 = local_a0;
            paVar8 = local_100;
            uVar23 = (ulong)uVar3;
            if ((int)uVar3 < 1) goto LAB_0016b3d9;
            pcVar22 = pcVar12;
            if (uVar3 == local_90) {
              pcVar22 = (char *)0x0;
            }
            if ((char)local_9c != '\0') {
              pcVar22 = (char *)0x0;
            }
            local_d0 = pcVar12 + uVar23;
            local_f8 = local_f8 - uVar23;
            uVar19 = (undefined4)local_b8;
            if ((0x1d2ff < local_a0) || (uVar6 = local_a0 >> 8, ""[uVar6] == '\0')) {
              if (local_f0 == (char *)0x0) {
                local_e8 = uVar23;
                lVar10 = (*local_e0)(pcVar18,(long)pcVar17 - (long)pcVar18,local_104);
                if (lVar10 == 0) {
                  sVar11 = (long)pcVar18 - (long)local_100->s;
                  lVar24 = local_f8 * local_c8 + local_d8;
                  while( true ) {
                    local_100->length = sVar11;
                    paVar8 = archive_string_ensure(local_100,local_100->buffer_length + lVar24);
                    if (paVar8 == (archive_string *)0x0) break;
                    pcVar18 = local_100->s + local_100->length;
                    pcVar17 = local_100->s + local_b0 + local_100->buffer_length;
                    lVar10 = (*local_e0)(pcVar18,(long)pcVar17 - (long)pcVar18,local_104);
                    if (lVar10 != 0) goto LAB_0016a72b;
                    sVar11 = (long)pcVar18 - (long)local_100->s;
                  }
                  goto LAB_0016b359;
                }
                goto LAB_0016a72b;
              }
              if (pcVar17 < pcVar18 + (local_b8 & 0xffffffff)) {
                local_100->length = (long)pcVar18 - (long)local_100->s;
                local_a8 = pcVar22;
                paVar9 = archive_string_ensure
                                   (local_100,
                                    local_f8 * local_c8 + local_d8 + local_100->buffer_length);
                if (paVar9 == (archive_string *)0x0) {
LAB_0016a998:
                  iVar16 = 1;
                  goto LAB_0016a750;
                }
                pcVar18 = paVar8->s + paVar8->length;
                pcVar17 = paVar8->s + local_b0 + paVar8->buffer_length;
                uVar19 = (undefined4)local_b8;
                pcVar22 = local_a8;
              }
              switch(uVar19) {
              case 4:
switchD_0016a8fb_caseD_4:
                cVar1 = *local_f0;
                local_f0 = local_f0 + 1;
                *pcVar18 = cVar1;
                pcVar18 = pcVar18 + 1;
              case 3:
switchD_0016a8fb_caseD_3:
                cVar1 = *local_f0;
                local_f0 = local_f0 + 1;
                *pcVar18 = cVar1;
                pcVar18 = pcVar18 + 1;
              case 2:
switchD_0016a8fb_caseD_2:
                cVar1 = *local_f0;
                local_f0 = local_f0 + 1;
                *pcVar18 = cVar1;
                pcVar18 = pcVar18 + 1;
              case 1:
switchD_0016a8fb_caseD_1:
                *pcVar18 = *local_f0;
                pcVar18 = pcVar18 + 1;
              }
              goto switchD_0016a8fb_default;
            }
            if (local_104 - 0x1100 < 0x13) {
              if (local_a0 - 0x1161 < 0x15) {
                local_104 = ((local_104 - 0x1100) * 0x15 + (local_a0 - 0x1161)) * 0x1c + 0xac00;
LAB_0016a7a8:
                local_b8 = local_b8 & 0xffffffff;
                pcVar22 = (char *)0x0;
              }
              else {
                if (local_f0 != (char *)0x0) {
                  if (pcVar17 < pcVar18 + (local_b8 & 0xffffffff)) {
                    local_100->length = (long)pcVar18 - (long)local_100->s;
                    local_a8 = pcVar22;
                    paVar9 = archive_string_ensure
                                       (local_100,
                                        local_f8 * local_c8 + local_d8 + local_100->buffer_length);
                    if (paVar9 == (archive_string *)0x0) goto LAB_0016a998;
                    pcVar18 = paVar8->s + paVar8->length;
                    pcVar17 = paVar8->s + local_b0 + paVar8->buffer_length;
                    uVar19 = (undefined4)local_b8;
                    pcVar22 = local_a8;
                  }
                  switch(uVar19) {
                  case 1:
                    goto switchD_0016a8fb_caseD_1;
                  case 2:
                    goto switchD_0016a8fb_caseD_2;
                  case 3:
                    goto switchD_0016a8fb_caseD_3;
                  case 4:
                    goto switchD_0016a8fb_caseD_4;
                  }
                  goto switchD_0016a8fb_default;
                }
                local_e8 = uVar23;
                lVar10 = (*local_e0)(pcVar18,(long)pcVar17 - (long)pcVar18,local_104);
                if (lVar10 == 0) {
                  sVar11 = (long)pcVar18 - (long)local_100->s;
                  lVar24 = local_f8 * local_c8 + local_d8;
                  while( true ) {
                    local_100->length = sVar11;
                    paVar8 = archive_string_ensure(local_100,local_100->buffer_length + lVar24);
                    if (paVar8 == (archive_string *)0x0) break;
                    pcVar18 = local_100->s + local_100->length;
                    pcVar17 = local_100->s + local_b0 + local_100->buffer_length;
                    lVar10 = (*local_e0)(pcVar18,(long)pcVar17 - (long)pcVar18,local_104);
                    if (lVar10 != 0) goto LAB_0016a72b;
                    sVar11 = (long)pcVar18 - (long)local_100->s;
                  }
                  goto LAB_0016b359;
                }
LAB_0016a72b:
                pcVar18 = pcVar18 + lVar10;
                uVar23 = local_e8;
switchD_0016a8fb_default:
                local_b8 = (ulong)uVar3;
                local_104 = local_a0;
              }
LAB_0016a746:
              iVar16 = 10;
              local_f0 = pcVar22;
            }
            else {
              uVar4 = local_104 - 0xac00;
              if ((uVar4 < 0x2ba4) && (uVar4 == (uVar4 / 0x1c) * 0x1c)) {
                if (local_a0 - 0x11a8 < 0x1b) {
                  local_104 = (local_a0 + local_104) - 0x11a7;
                  goto LAB_0016a7a8;
                }
                if (local_f0 != (char *)0x0) {
                  if (pcVar17 < pcVar18 + (local_b8 & 0xffffffff)) {
                    local_100->length = (long)pcVar18 - (long)local_100->s;
                    local_a8 = pcVar22;
                    paVar9 = archive_string_ensure
                                       (local_100,
                                        local_f8 * local_c8 + local_d8 + local_100->buffer_length);
                    if (paVar9 == (archive_string *)0x0) goto LAB_0016a998;
                    pcVar18 = paVar8->s + paVar8->length;
                    pcVar17 = paVar8->s + local_b0 + paVar8->buffer_length;
                    uVar19 = (undefined4)local_b8;
                    pcVar22 = local_a8;
                  }
                  switch(uVar19) {
                  case 1:
                    goto switchD_0016a8fb_caseD_1;
                  case 2:
                    goto switchD_0016a8fb_caseD_2;
                  case 3:
                    goto switchD_0016a8fb_caseD_3;
                  case 4:
                    goto switchD_0016a8fb_caseD_4;
                  }
                  goto switchD_0016a8fb_default;
                }
                local_e8 = uVar23;
                lVar10 = (*local_e0)(pcVar18,(long)pcVar17 - (long)pcVar18,local_104);
                if (lVar10 == 0) {
                  sVar11 = (long)pcVar18 - (long)local_100->s;
                  lVar24 = local_f8 * local_c8 + local_d8;
                  while( true ) {
                    local_100->length = sVar11;
                    paVar8 = archive_string_ensure(local_100,local_100->buffer_length + lVar24);
                    if (paVar8 == (archive_string *)0x0) break;
                    pcVar18 = local_100->s + local_100->length;
                    pcVar17 = local_100->s + local_b0 + local_100->buffer_length;
                    lVar10 = (*local_e0)(pcVar18,(long)pcVar17 - (long)pcVar18,local_104);
                    if (lVar10 != 0) goto LAB_0016a72b;
                    sVar11 = (long)pcVar18 - (long)local_100->s;
                  }
                  goto LAB_0016b359;
                }
                goto LAB_0016a72b;
              }
              local_a8 = (char *)CONCAT44(local_a8._4_4_,uVar3);
              local_e8 = uVar23;
              uVar5 = get_nfc(local_104,local_a0);
              if (uVar5 == 0) {
                uVar3 = 0;
                if (uVar21 < 0x1d245) {
                  uVar3 = (uint)ccc_val[ccc_val_index[""[uVar6]][uVar21 >> 4 & 0xf]][uVar21 & 0xf];
                }
                if (uVar3 != 0) {
                  local_88 = uVar21;
                  local_58[0] = uVar3;
                  uVar21 = (*local_98)(&local_84,local_d0,local_f8);
                  uVar23 = (ulong)uVar21;
                  if ((int)uVar21 < 1) {
                    uVar15 = 1;
                    uVar21 = 0;
                  }
                  else {
                    uVar15 = 1;
                    puVar20 = local_80;
                    do {
                      uVar6 = (&local_88)[uVar15];
                      uVar21 = 0;
                      if (uVar6 < 0x1d245) {
                        uVar21 = (uint)ccc_val[ccc_val_index[""[uVar6 >> 8]][uVar6 >> 4 & 0xf]]
                                       [uVar6 & 0xf];
                      }
                      if (((uVar21 != 0xe4) && (uVar3 != 0xe4)) && (uVar21 <= uVar3)) break;
                      local_d0 = local_d0 + uVar23;
                      local_f8 = local_f8 - uVar23;
                      local_58[uVar15] = uVar21;
                      uVar3 = uVar21;
                      if (uVar15 == 9) {
                        uVar15 = 10;
                        break;
                      }
                      uVar6 = (*local_98)(puVar20,local_d0,local_f8);
                      uVar23 = (ulong)uVar6;
                      puVar20 = puVar20 + 4;
                      uVar15 = uVar15 + 1;
                    } while (0 < (int)uVar6);
                  }
                  iVar7 = (int)uVar23;
                  bVar26 = 9 < (uint)uVar15;
                  if (bVar26) {
                    local_bc = L'\xffffffff';
                  }
                  uVar15 = uVar15 & 0xffffffff;
                  if (bVar26) {
                    uVar15 = 10;
                  }
                  if (1 < (int)uVar15) {
                    uVar6 = 1;
                    do {
                      local_a8 = (char *)CONCAT44(local_a8._4_4_,uVar21);
                      uVar5 = get_nfc(local_104,(&local_88)[(int)uVar6]);
                      uVar21 = (uint)local_a8;
                      if (uVar5 == 0) {
                        uVar6 = uVar6 + 1;
                      }
                      else {
                        iVar7 = uVar6 + 1;
                        iVar16 = (int)uVar15;
                        if (iVar7 < iVar16) {
                          lVar10 = 0;
                          do {
                            iVar14 = uVar6 + (int)lVar10;
                            (&local_88)[iVar14] = (&local_88)[iVar7 + lVar10];
                            local_58[iVar14] = local_58[iVar7 + lVar10];
                            lVar10 = lVar10 + 1;
                          } while ((1 - iVar16) + uVar6 + (int)lVar10 != 0);
                        }
                        uVar4 = iVar16 - 1;
                        local_104 = uVar5;
                        if ((iVar16 < 2) || (local_f0 = (char *)0x0, uVar6 != uVar4)) {
                          local_f0 = (char *)0x0;
                          uVar6 = 0;
                          uVar15 = (ulong)uVar4;
                        }
                        else {
                          if ((0 < (int)uVar23) && ((uint)local_a8 == uVar3)) {
                            uVar3 = local_58[iVar16 - 2];
                            if (iVar16 < 0xb) {
                              lVar10 = (long)(int)uVar4;
                              uVar21 = (*local_98)(&local_88 + lVar10,local_d0,local_f8);
                              uVar23 = (ulong)uVar21;
                              if ((int)uVar21 < 1) {
                                uVar21 = (uint)local_a8;
                              }
                              else {
                                puVar20 = local_80 + lVar10 * 4 + -4;
                                sVar11 = local_f8;
                                do {
                                  uVar6 = *(uint *)(puVar20 + -4);
                                  uVar21 = 0;
                                  if (uVar6 < 0x1d245) {
                                    uVar21 = (uint)ccc_val[ccc_val_index[""[uVar6 >> 8]]
                                                           [uVar6 >> 4 & 0xf]][uVar6 & 0xf];
                                  }
                                  if (((uVar21 != 0xe4) && (uVar3 != 0xe4)) &&
                                     ((int)uVar21 <= (int)uVar3)) break;
                                  local_d0 = local_d0 + uVar23;
                                  sVar11 = sVar11 - uVar23;
                                  local_58[lVar10] = uVar21;
                                  uVar3 = uVar21;
                                  if (lVar10 == 9) {
                                    uVar4 = 10;
                                    local_f8 = sVar11;
                                    goto LAB_0016af2c;
                                  }
                                  uVar6 = (*local_98)(puVar20,local_d0,sVar11);
                                  uVar23 = (ulong)uVar6;
                                  lVar10 = lVar10 + 1;
                                  puVar20 = puVar20 + 4;
                                } while (0 < (int)uVar6);
                                local_f8 = sVar11;
                                uVar4 = (uint)lVar10;
                              }
                            }
LAB_0016af2c:
                            if (9 < (int)uVar4) {
                              local_bc = L'\xffffffff';
                            }
                            if (9 < (int)uVar4) {
                              uVar4 = 10;
                            }
                          }
                          local_f0 = (char *)0x0;
                          uVar6 = 0;
                          uVar15 = (ulong)uVar4;
                        }
                      }
                      iVar7 = (int)uVar23;
                    } while ((int)uVar6 < (int)uVar15);
                  }
                  uVar23 = local_b8;
                  pcVar12 = local_f0;
                  local_8c = uVar3;
                  if (local_f0 == (char *)0x0) {
                    local_a8 = (char *)CONCAT44(local_a8._4_4_,uVar21);
                    lVar10 = (*local_e0)(pcVar18,(long)pcVar17 - (long)pcVar18,local_104);
                    if (lVar10 == 0) {
                      sVar11 = (long)pcVar18 - (long)local_100->s;
                      lVar24 = local_f8 * local_c8 + local_d8;
                      while( true ) {
                        local_100->length = sVar11;
                        paVar8 = archive_string_ensure(local_100,local_100->buffer_length + lVar24);
                        if (paVar8 == (archive_string *)0x0) break;
                        pcVar18 = local_100->s + local_100->length;
                        pcVar17 = local_100->s + local_b0 + local_100->buffer_length;
                        lVar10 = (*local_e0)(pcVar18,(long)pcVar17 - (long)pcVar18,local_104);
                        if (lVar10 != 0) goto LAB_0016b027;
                        sVar11 = (long)pcVar18 - (long)local_100->s;
                      }
                      goto LAB_0016b359;
                    }
LAB_0016b027:
                    pcVar18 = pcVar18 + lVar10;
                  }
                  else {
                    if (pcVar17 < pcVar18 + (local_b8 & 0xffffffff)) {
                      local_100->length = (long)pcVar18 - (long)local_100->s;
                      paVar8 = archive_string_ensure
                                         (local_100,
                                          local_f8 * local_c8 + local_d8 + local_100->buffer_length)
                      ;
                      if (paVar8 == (archive_string *)0x0) goto LAB_0016b2e0;
                      pcVar18 = local_100->s + local_100->length;
                      pcVar17 = local_100->s + local_b0 + local_100->buffer_length;
                    }
                    local_a8 = (char *)CONCAT44(local_a8._4_4_,uVar21);
                    switch((int)uVar23) {
                    case 1:
                      goto LAB_0016b0db;
                    case 2:
                      goto LAB_0016b0cf;
                    case 3:
                      break;
                    case 4:
                      cVar1 = *local_f0;
                      local_f0 = local_f0 + 1;
                      *pcVar18 = cVar1;
                      pcVar18 = pcVar18 + 1;
                      break;
                    default:
                      goto switchD_0016affb_default;
                    }
                    cVar1 = *local_f0;
                    local_f0 = local_f0 + 1;
                    *pcVar18 = cVar1;
                    pcVar18 = pcVar18 + 1;
LAB_0016b0cf:
                    cVar1 = *local_f0;
                    local_f0 = local_f0 + 1;
                    *pcVar18 = cVar1;
                    pcVar18 = pcVar18 + 1;
LAB_0016b0db:
                    *pcVar18 = *local_f0;
                    pcVar18 = pcVar18 + 1;
switchD_0016affb_default:
                    pcVar12 = (char *)0x0;
                  }
                  local_f0 = pcVar12;
                  if (0 < (int)uVar15) {
                    lVar10 = local_f8 * local_c8 + local_d8;
                    uVar23 = 0;
                    do {
                      while (lVar24 = (*local_e0)(pcVar18,(long)pcVar17 - (long)pcVar18,
                                                  (&local_88)[uVar23]), lVar24 == 0) {
                        local_100->length = (long)pcVar18 - (long)local_100->s;
                        paVar8 = archive_string_ensure(local_100,local_100->buffer_length + lVar10);
                        if (paVar8 == (archive_string *)0x0) goto LAB_0016b359;
                        pcVar18 = local_100->s + local_100->length;
                        pcVar17 = local_100->s + local_b0 + local_100->buffer_length;
                      }
                      pcVar18 = pcVar18 + lVar24;
                      uVar23 = uVar23 + 1;
                    } while (uVar23 != uVar15);
                  }
                  iVar16 = 0xb;
                  uVar23 = local_e8;
                  if (((0 < iVar7) && ((uint)local_a8 == local_8c)) && (local_f8 != 0)) {
                    uVar3 = (*local_98)(&local_88,local_d0,local_f8);
                    uVar21 = local_8c;
                    while (0 < (int)uVar3) {
                      uVar6 = 0;
                      if (local_88 < 0x1d245) {
                        uVar6 = (uint)ccc_val[ccc_val_index[""[local_88 >> 8]][local_88 >> 4 & 0xf]]
                                      [local_88 & 0xf];
                      }
                      if ((int)uVar6 < (int)uVar21) break;
                      local_d0 = local_d0 + uVar3;
                      local_f8 = local_f8 - uVar3;
                      lVar10 = (*local_e0)(pcVar18,(long)pcVar17 - (long)pcVar18,local_88);
                      if (lVar10 == 0) {
                        sVar11 = (long)pcVar18 - (long)local_100->s;
                        lVar24 = local_f8 * local_c8 + local_d8;
                        while( true ) {
                          local_100->length = sVar11;
                          paVar8 = archive_string_ensure
                                             (local_100,local_100->buffer_length + lVar24);
                          if (paVar8 == (archive_string *)0x0) goto LAB_0016b2e0;
                          pcVar18 = local_100->s + local_100->length;
                          pcVar17 = local_100->s + local_b0 + local_100->buffer_length;
                          lVar10 = (*local_e0)(pcVar18,(long)pcVar17 - (long)pcVar18,local_88);
                          if (lVar10 != 0) break;
                          sVar11 = (long)pcVar18 - (long)local_100->s;
                        }
                      }
                      pcVar18 = pcVar18 + lVar10;
                      uVar3 = (*local_98)(&local_88,local_d0,local_f8);
                      uVar21 = uVar6;
                    }
                    iVar16 = 0xb;
                    uVar23 = local_e8;
                  }
                  goto LAB_0016a750;
                }
                if (local_f0 == (char *)0x0) {
                  lVar10 = (*local_e0)(pcVar18,(long)pcVar17 - (long)pcVar18,local_104);
                  if (lVar10 == 0) {
                    sVar11 = (long)pcVar18 - (long)local_100->s;
                    lVar24 = local_f8 * local_c8 + local_d8;
                    while( true ) {
                      local_100->length = sVar11;
                      paVar8 = archive_string_ensure(local_100,local_100->buffer_length + lVar24);
                      if (paVar8 == (archive_string *)0x0) break;
                      pcVar18 = local_100->s + local_100->length;
                      pcVar17 = local_100->s + local_b0 + local_100->buffer_length;
                      lVar10 = (*local_e0)(pcVar18,(long)pcVar17 - (long)pcVar18,local_104);
                      if (lVar10 != 0) goto LAB_0016acd5;
                      sVar11 = (long)pcVar18 - (long)local_100->s;
                    }
LAB_0016b359:
                    iVar16 = 1;
                    uVar23 = local_e8;
                    goto LAB_0016a750;
                  }
LAB_0016acd5:
                  pcVar18 = pcVar18 + lVar10;
                }
                else {
                  uVar19 = (undefined4)local_b8;
                  if (pcVar17 < pcVar18 + (local_b8 & 0xffffffff)) {
                    local_100->length = (long)pcVar18 - (long)local_100->s;
                    paVar8 = archive_string_ensure
                                       (local_100,
                                        local_f8 * local_c8 + local_d8 + local_100->buffer_length);
                    if (paVar8 == (archive_string *)0x0) {
LAB_0016b2e0:
                      iVar16 = 1;
                      uVar23 = local_e8;
                      goto LAB_0016a750;
                    }
                    pcVar18 = local_100->s + local_100->length;
                    pcVar17 = local_100->s + local_b0 + local_100->buffer_length;
                  }
                  switch(uVar19) {
                  case 1:
                    goto LAB_0016b39f;
                  case 2:
                    goto LAB_0016b393;
                  case 3:
                    break;
                  case 4:
                    cVar1 = *local_f0;
                    local_f0 = local_f0 + 1;
                    *pcVar18 = cVar1;
                    pcVar18 = pcVar18 + 1;
                    break;
                  default:
                    goto switchD_0016aca3_default;
                  }
                  cVar1 = *local_f0;
                  local_f0 = local_f0 + 1;
                  *pcVar18 = cVar1;
                  pcVar18 = pcVar18 + 1;
LAB_0016b393:
                  cVar1 = *local_f0;
                  local_f0 = local_f0 + 1;
                  *pcVar18 = cVar1;
                  pcVar18 = pcVar18 + 1;
LAB_0016b39f:
                  *pcVar18 = *local_f0;
                  pcVar18 = pcVar18 + 1;
                }
switchD_0016aca3_default:
                local_104 = local_a0;
                local_b8 = (ulong)(uint)local_a8;
                uVar23 = local_e8;
                goto LAB_0016a746;
              }
              iVar16 = 10;
              local_f0 = (char *)0x0;
              uVar23 = local_e8;
              local_104 = uVar5;
            }
LAB_0016a750:
          } while (iVar16 == 10);
          pcVar12 = local_d0;
          if (iVar16 != 0xb) goto switchD_0016b477_default;
LAB_0016b3d9:
          uVar19 = (undefined4)local_b8;
          if ((int)uVar23 < 0) {
            if (local_f0 == (char *)0x0) {
              local_e8 = uVar23;
              lVar10 = (*local_e0)(pcVar18,(long)pcVar17 - (long)pcVar18,local_104);
              if (lVar10 != 0) {
LAB_0016b5cf:
                pcVar18 = pcVar18 + lVar10;
                goto switchD_0016b534_default;
              }
              sVar11 = (long)pcVar18 - (long)local_100->s;
              lVar24 = local_f8 * local_c8 + local_d8;
              local_d0 = pcVar12;
              while( true ) {
                local_100->length = sVar11;
                paVar8 = archive_string_ensure(local_100,local_100->buffer_length + lVar24);
                pcVar12 = local_d0;
                if (paVar8 == (archive_string *)0x0) break;
                pcVar18 = local_100->s + local_100->length;
                pcVar17 = local_100->s + local_b0 + local_100->buffer_length;
                lVar10 = (*local_e0)(pcVar18,(long)pcVar17 - (long)pcVar18,local_104);
                pcVar12 = local_d0;
                if (lVar10 != 0) goto LAB_0016b5cf;
                sVar11 = (long)pcVar18 - (long)local_100->s;
              }
            }
            else {
              if (pcVar17 < pcVar18 + (local_b8 & 0xffffffff)) {
                local_100->length = (long)pcVar18 - (long)local_100->s;
                paVar8 = archive_string_ensure
                                   (local_100,
                                    local_f8 * local_c8 + local_d8 + local_100->buffer_length);
                if (paVar8 == (archive_string *)0x0) goto LAB_0016b681;
                pcVar18 = local_100->s + local_100->length;
                pcVar17 = local_100->s + local_b0 + local_100->buffer_length;
              }
              local_e8 = uVar23;
              switch((int)local_b8) {
              case 1:
                pcVar22 = local_f0;
                goto LAB_0016b6bf;
              case 2:
                pcVar22 = local_f0;
                goto LAB_0016b6b3;
              case 3:
                pcVar22 = local_f0;
                break;
              case 4:
                *pcVar18 = *local_f0;
                pcVar18 = pcVar18 + 1;
                pcVar22 = local_f0 + 1;
                break;
              default:
                goto switchD_0016b534_default;
              }
              *pcVar18 = *pcVar22;
              pcVar18 = pcVar18 + 1;
              pcVar22 = pcVar22 + 1;
LAB_0016b6b3:
              *pcVar18 = *pcVar22;
              pcVar18 = pcVar18 + 1;
              pcVar22 = pcVar22 + 1;
LAB_0016b6bf:
              *pcVar18 = *pcVar22;
              pcVar18 = pcVar18 + 1;
switchD_0016b534_default:
              lVar10 = (*local_e0)(pcVar18,(long)pcVar17 - (long)pcVar18,local_a0);
              local_d0 = pcVar12;
              if (lVar10 != 0) {
LAB_0016b6de:
                pcVar18 = pcVar18 + lVar10;
                iVar7 = (int)local_e8;
                goto LAB_0016b6e6;
              }
              sVar11 = (long)pcVar18 - (long)local_100->s;
              lVar24 = local_f8 * local_c8 + local_d8;
              while( true ) {
                local_100->length = sVar11;
                paVar8 = archive_string_ensure(local_100,local_100->buffer_length + lVar24);
                pcVar12 = local_d0;
                if (paVar8 == (archive_string *)0x0) break;
                pcVar18 = local_100->s + local_100->length;
                pcVar17 = local_100->s + local_b0 + local_100->buffer_length;
                lVar10 = (*local_e0)(pcVar18,(long)pcVar17 - (long)pcVar18,local_a0);
                if (lVar10 != 0) goto LAB_0016b6de;
                sVar11 = (long)pcVar18 - (long)local_100->s;
              }
            }
LAB_0016b681:
            local_d0 = pcVar12;
            iVar16 = 1;
          }
          else {
            iVar16 = 0;
            local_d0 = pcVar12;
            if ((int)uVar23 == 0) {
              if (local_f0 == (char *)0x0) {
                lVar10 = (*local_e0)(pcVar18,(long)pcVar17 - (long)pcVar18,local_104);
                if (lVar10 == 0) {
                  sVar11 = (long)pcVar18 - (long)local_100->s;
                  lVar24 = local_f8 * local_c8 + local_d8;
                  while( true ) {
                    local_100->length = sVar11;
                    paVar8 = archive_string_ensure(local_100,local_100->buffer_length + lVar24);
                    pcVar12 = local_d0;
                    if (paVar8 == (archive_string *)0x0) break;
                    pcVar18 = local_100->s + local_100->length;
                    pcVar17 = local_100->s + local_b0 + local_100->buffer_length;
                    lVar10 = (*local_e0)(pcVar18,(long)pcVar17 - (long)pcVar18,local_104);
                    if (lVar10 != 0) goto LAB_0016b5fb;
                    sVar11 = (long)pcVar18 - (long)local_100->s;
                  }
                  goto LAB_0016b681;
                }
LAB_0016b5fb:
                pcVar18 = pcVar18 + lVar10;
                iVar16 = 3;
                goto switchD_0016b477_default;
              }
              if (pcVar17 < pcVar18 + (local_b8 & 0xffffffff)) {
                local_100->length = (long)pcVar18 - (long)local_100->s;
                paVar8 = archive_string_ensure
                                   (local_100,
                                    local_f8 * local_c8 + local_d8 + local_100->buffer_length);
                pcVar12 = local_d0;
                if (paVar8 == (archive_string *)0x0) goto LAB_0016b681;
                pcVar18 = local_100->s + local_100->length;
                pcVar17 = local_100->s + local_b0 + local_100->buffer_length;
              }
              iVar16 = 3;
              switch(uVar19) {
              case 1:
                pcVar12 = local_f0;
                goto LAB_0016b85a;
              case 2:
                pcVar12 = local_f0;
                goto LAB_0016b84e;
              case 3:
                pcVar12 = local_f0;
                break;
              case 4:
                *pcVar18 = *local_f0;
                pcVar18 = pcVar18 + 1;
                pcVar12 = local_f0 + 1;
                break;
              default:
                goto switchD_0016b477_default;
              }
              *pcVar18 = *pcVar12;
              pcVar18 = pcVar18 + 1;
              pcVar12 = pcVar12 + 1;
LAB_0016b84e:
              *pcVar18 = *pcVar12;
              pcVar18 = pcVar18 + 1;
              pcVar12 = pcVar12 + 1;
LAB_0016b85a:
              *pcVar18 = *pcVar12;
              pcVar18 = pcVar18 + 1;
            }
          }
        }
switchD_0016b477_default:
        _p = local_d0;
        if ((iVar16 != 0) && (iVar16 != 2)) {
          if (iVar16 != 3) goto LAB_0016b8b6;
          break;
        }
        local_b8 = (*local_98)(&local_104,local_d0,local_f8);
      } while ((int)local_b8 != 0);
    }
    local_100->length = (long)pcVar18 - (long)local_100->s;
    *pcVar18 = '\0';
    if ((char)local_60 != '\0') {
      local_100->s[local_100->length + 1] = '\0';
    }
  }
  return local_bc;
}

Assistant:

static int
archive_string_normalize_C(struct archive_string *as, const void *_p,
    size_t len, struct archive_string_conv *sc)
{
	const char *s = (const char *)_p;
	char *p, *endp;
	uint32_t uc, uc2;
	size_t w;
	int always_replace, n, n2, ret = 0, spair, ts, tm;
	int (*parse)(uint32_t *, const char *, size_t);
	size_t (*unparse)(char *, size_t, uint32_t);

	always_replace = 1;
	ts = 1;/* text size. */
	if (sc->flag & SCONV_TO_UTF16BE) {
		unparse = unicode_to_utf16be;
		ts = 2;
		if (sc->flag & SCONV_FROM_UTF16BE)
			always_replace = 0;
	} else if (sc->flag & SCONV_TO_UTF16LE) {
		unparse = unicode_to_utf16le;
		ts = 2;
		if (sc->flag & SCONV_FROM_UTF16LE)
			always_replace = 0;
	} else if (sc->flag & SCONV_TO_UTF8) {
		unparse = unicode_to_utf8;
		if (sc->flag & SCONV_FROM_UTF8)
			always_replace = 0;
	} else {
		/*
		 * This case is going to be converted to another
		 * character-set through iconv.
		 */
		always_replace = 0;
		if (sc->flag & SCONV_FROM_UTF16BE) {
			unparse = unicode_to_utf16be;
			ts = 2;
		} else if (sc->flag & SCONV_FROM_UTF16LE) {
			unparse = unicode_to_utf16le;
			ts = 2;
		} else {
			unparse = unicode_to_utf8;
		}
	}

	if (sc->flag & SCONV_FROM_UTF16BE) {
		parse = utf16be_to_unicode;
		tm = 1;
		spair = 4;/* surrogate pair size in UTF-16. */
	} else if (sc->flag & SCONV_FROM_UTF16LE) {
		parse = utf16le_to_unicode;
		tm = 1;
		spair = 4;/* surrogate pair size in UTF-16. */
	} else {
		parse = cesu8_to_unicode;
		tm = ts;
		spair = 6;/* surrogate pair size in UTF-8. */
	}

	if (archive_string_ensure(as, as->length + len * tm + ts) == NULL)
		return (-1);

	p = as->s + as->length;
	endp = as->s + as->buffer_length - ts;
	while ((n = parse(&uc, s, len)) != 0) {
		const char *ucptr, *uc2ptr;

		if (n < 0) {
			/* Use a replaced unicode character. */
			UNPARSE(p, endp, uc);
			s += n*-1;
			len -= n*-1;
			ret = -1;
			continue;
		} else if (n == spair || always_replace)
			/* uc is converted from a surrogate pair.
			 * this should be treated as a changed code. */
			ucptr = NULL;
		else
			ucptr = s;
		s += n;
		len -= n;

		/* Read second code point. */
		while ((n2 = parse(&uc2, s, len)) > 0) {
			uint32_t ucx[FDC_MAX];
			int ccx[FDC_MAX];
			int cl, cx, i, nx, ucx_size;
			int LIndex,SIndex;
			uint32_t nfc;

			if (n2 == spair || always_replace)
				/* uc2 is converted from a surrogate pair.
			 	 * this should be treated as a changed code. */
				uc2ptr = NULL;
			else
				uc2ptr = s;
			s += n2;
			len -= n2;

			/*
			 * If current second code point is out of decomposable
			 * code points, finding compositions is unneeded.
			 */
			if (!IS_DECOMPOSABLE_BLOCK(uc2)) {
				WRITE_UC();
				REPLACE_UC_WITH_UC2();
				continue;
			}

			/*
			 * Try to combine current code points.
			 */
			/*
			 * We have to combine Hangul characters according to
			 * http://uniicode.org/reports/tr15/#Hangul
			 */
			if (0 <= (LIndex = uc - HC_LBASE) &&
			    LIndex < HC_LCOUNT) {
				/*
				 * Hangul Composition.
				 * 1. Two current code points are L and V.
				 */
				int VIndex = uc2 - HC_VBASE;
				if (0 <= VIndex && VIndex < HC_VCOUNT) {
					/* Make syllable of form LV. */
					UPDATE_UC(HC_SBASE +
					    (LIndex * HC_VCOUNT + VIndex) *
					     HC_TCOUNT);
				} else {
					WRITE_UC();
					REPLACE_UC_WITH_UC2();
				}
				continue;
			} else if (0 <= (SIndex = uc - HC_SBASE) &&
			    SIndex < HC_SCOUNT && (SIndex % HC_TCOUNT) == 0) {
				/*
				 * Hangul Composition.
				 * 2. Two current code points are LV and T.
				 */
				int TIndex = uc2 - HC_TBASE;
				if (0 < TIndex && TIndex < HC_TCOUNT) {
					/* Make syllable of form LVT. */
					UPDATE_UC(uc + TIndex);
				} else {
					WRITE_UC();
					REPLACE_UC_WITH_UC2();
				}
				continue;
			} else if ((nfc = get_nfc(uc, uc2)) != 0) {
				/* A composition to current code points
				 * is found. */
				UPDATE_UC(nfc);
				continue;
			} else if ((cl = CCC(uc2)) == 0) {
				/* Clearly 'uc2' the second code point is not
				 * a decomposable code. */
				WRITE_UC();
				REPLACE_UC_WITH_UC2();
				continue;
			}

			/*
			 * Collect following decomposable code points.
			 */
			cx = 0;
			ucx[0] = uc2;
			ccx[0] = cl;
			COLLECT_CPS(1);

			/*
			 * Find a composed code in the collected code points.
			 */
			i = 1;
			while (i < ucx_size) {
				int j;

				if ((nfc = get_nfc(uc, ucx[i])) == 0) {
					i++;
					continue;
				}

				/*
				 * nfc is composed of uc and ucx[i].
				 */
				UPDATE_UC(nfc);

				/*
				 * Remove ucx[i] by shifting
				 * following code points.
				 */
				for (j = i; j+1 < ucx_size; j++) {
					ucx[j] = ucx[j+1];
					ccx[j] = ccx[j+1];
				}
				ucx_size --;

				/*
				 * Collect following code points blocked
				 * by ucx[i] the removed code point.
				 */
				if (ucx_size > 0 && i == ucx_size &&
				    nx > 0 && cx == cl) {
					cl =  ccx[ucx_size-1];
					COLLECT_CPS(ucx_size);
				}
				/*
				 * Restart finding a composed code with
				 * the updated uc from the top of the
				 * collected code points.
				 */
				i = 0;
			}

			/*
			 * Apparently the current code points are not
			 * decomposed characters or already composed.
			 */
			WRITE_UC();
			for (i = 0; i < ucx_size; i++)
				UNPARSE(p, endp, ucx[i]);

			/*
			 * Flush out remaining canonical combining characters.
			 */
			if (nx > 0 && cx == cl && len > 0) {
				while ((nx = parse(&ucx[0], s, len))
				    > 0) {
					cx = CCC(ucx[0]);
					if (cl > cx)
						break;
					s += nx;
					len -= nx;
					cl = cx;
					UNPARSE(p, endp, ucx[0]);
				}
			}
			break;
		}
		if (n2 < 0) {
			WRITE_UC();
			/* Use a replaced unicode character. */
			UNPARSE(p, endp, uc2);
			s += n2*-1;
			len -= n2*-1;
			ret = -1;
			continue;
		} else if (n2 == 0) {
			WRITE_UC();
			break;
		}
	}
	as->length = p - as->s;
	as->s[as->length] = '\0';
	if (ts == 2)
		as->s[as->length+1] = '\0';
	return (ret);
}